

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  Curl_easy *data;
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_460;
  char unknown [32];
  char ssl_buf [1024];
  
  if (userp == (void *)0x0) {
    return;
  }
  data = *userp;
  if (data == (Curl_easy *)0x0) {
    return;
  }
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    return;
  }
  if (1 < (uint)direction) {
    return;
  }
  switch(ssl_ver) {
  case 0x300:
    pcVar3 = "SSLv3";
    break;
  case 0x301:
    pcVar3 = "TLSv1.0";
    break;
  case 0x302:
    pcVar3 = "TLSv1.1";
    break;
  case 0x303:
    pcVar3 = "TLSv1.2";
    break;
  case 0x304:
    pcVar3 = "TLSv1.3";
    break;
  default:
    if (ssl_ver == 0) goto LAB_0014803d;
    if (ssl_ver == 2) {
      pcVar3 = "SSLv2";
    }
    else {
      curl_msnprintf(unknown,0x20,"(%x)",(ulong)(uint)ssl_ver);
      pcVar3 = unknown;
    }
  }
  if (content_type == 0x101 || ssl_ver == 0) goto LAB_0014803d;
  if (content_type == 0 || (ssl_ver & 0xffffff00U) != 0x300) {
    local_460 = "";
LAB_00147f2c:
    if (content_type != 0x15) {
      if (content_type == 0x14) goto LAB_00147f38;
      uVar5 = (ulong)(uint)(int)*buf;
      if ((ssl_ver & 0xffffff00U) == 0x300) goto LAB_00147f9a;
      goto switchD_00147fb5_caseD_3;
    }
LAB_00147fcf:
    uVar2 = (int)*(char *)((long)buf + 1) + *buf * 0x100;
    uVar5 = (ulong)uVar2;
    pcVar4 = SSL_alert_desc_string_long(uVar2);
  }
  else {
    switch(content_type) {
    case 0x14:
      local_460 = "TLS change cipher";
LAB_00147f38:
      uVar5 = (ulong)(uint)(int)*buf;
      pcVar4 = "Change cipher spec";
      goto LAB_00147ff1;
    case 0x15:
      local_460 = "TLS alert";
      goto LAB_00147fcf;
    case 0x16:
      local_460 = "TLS handshake";
      break;
    case 0x17:
      local_460 = "TLS app data";
      break;
    default:
      if (content_type != 0x100) {
        local_460 = "TLS Unknown";
        goto LAB_00147f2c;
      }
      local_460 = "TLS header";
    }
    uVar5 = (ulong)(uint)(int)*buf;
LAB_00147f9a:
    switch(uVar5) {
    case 0:
      pcVar4 = "Hello request";
      break;
    case 1:
      pcVar4 = "Client hello";
      break;
    case 2:
      pcVar4 = "Server hello";
      break;
    case 3:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x17:
switchD_00147fb5_caseD_3:
      pcVar4 = "Unknown";
      break;
    case 4:
      pcVar4 = "Newsession Ticket";
      break;
    case 5:
      pcVar4 = "End of early data";
      break;
    case 8:
      pcVar4 = "Encrypted Extensions";
      break;
    case 0xb:
      pcVar4 = "Certificate";
      break;
    case 0xc:
      pcVar4 = "Server key exchange";
      break;
    case 0xd:
      pcVar4 = "Request CERT";
      break;
    case 0xe:
      pcVar4 = "Server finished";
      break;
    case 0xf:
      pcVar4 = "CERT verify";
      break;
    case 0x10:
      pcVar4 = "Client key exchange";
      break;
    case 0x14:
      pcVar4 = "Finished";
      break;
    case 0x16:
      pcVar4 = "Certificate Status";
      break;
    case 0x18:
      pcVar4 = "Key update";
      break;
    default:
      if ((int)uVar5 != 0x43) goto switchD_00147fb5_caseD_3;
      pcVar4 = "Next protocol";
    }
  }
LAB_00147ff1:
  pcVar1 = "LOGOUT";
  if (direction == 0) {
    pcVar1 = "PLAIN";
  }
  uVar2 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",pcVar3,pcVar1 + 3,local_460,pcVar4,
                         uVar5);
  if (uVar2 < 0x400) {
    Curl_debug(data,CURLINFO_TEXT,ssl_buf,(ulong)uVar2);
  }
LAB_0014803d:
  Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len);
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  char unknown[32];
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    msnprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  /* Log progress for interesting records only (like Handshake or Alert), skip
   * all raw record headers (content_type == SSL3_RT_HEADER or ssl_ver == 0).
   * For TLS 1.3, skip notification of the decrypted inner Content Type.
   */
  if(ssl_ver
#ifdef SSL3_RT_INNER_CONTENT_TYPE
     && content_type != SSL3_RT_INNER_CONTENT_TYPE
#endif
    ) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((char *)buf)[0] << 8) + ((char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = msnprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                        verstr, direction?"OUT":"IN",
                        tls_rt_name, msg_name, msg_type);
    if(0 <= txt_len && (unsigned)txt_len < sizeof(ssl_buf)) {
      Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
    }
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len);
  (void) ssl;
}